

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_string_stream.hpp
# Opt level: O0

bool iutest::detail::StringToValue<int>(string *s,int *out)

{
  bool bVar1;
  long *plVar2;
  istringstream local_1a0 [8];
  istringstream strm;
  int *out_local;
  string *s_local;
  
  std::__cxx11::istringstream::istringstream(local_1a0,(string *)s,_S_in);
  plVar2 = (long *)std::istream::operator>>((istream *)local_1a0,out);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
  std::__cxx11::istringstream::~istringstream(local_1a0);
  return bVar1;
}

Assistant:

bool StringToValue(const ::std::string& s, T& out)
{
#if IUTEST_HAS_STRINGSTREAM
    ::std::istringstream strm(s);
    if( strm >> out )
    {
        return true;
    }
    return false;
#elif IUTEST_HAS_STD_STR_TO_VALUE
    out = static_cast<T>(::std::stoull(s));
    return true;
#else
    char* endptr=NULL;
    const char* p = s.c_str();
    errno = 0;
    const unsigned long long v = strtoull(p, &endptr, 10);
    if(p == endptr)
    {
#if IUTEST_HAS_EXCEPTIONS
        throw ::std::invalid_argument(p);
#else
        return false;
#endif
    }
    if(errno == ERANGE)
    {
#if IUTEST_HAS_EXCEPTIONS
        throw ::std::out_of_range(p);
#else
        return false;
#endif
    }
    out = static_cast<T>(v);
    return true;
#endif
}